

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O1

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::~ConcreteMachine
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  void *pvVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Flywheel *pFVar5;
  long lVar6;
  long lVar7;
  pointer *ppuVar8;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005a19d0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005a1a98;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005a1ae0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_005a1af8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_005a1b30;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a1b48;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a1b78;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_005a1bb8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_005a1bd0;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_005a1bf0;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_005a1c08;
  (this->super_MemorySlotChangeHandler)._vptr_MemorySlotChangeHandler = (_func_int **)&DAT_005a1c20;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&(this->speaker_).audio_queue);
  pcVar2 = (this->input_text_)._M_dataplus._M_p;
  paVar1 = &(this->input_text_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppuVar8 = (pointer *)
            ((long)&this->memory_slots_[3].super_PrimarySlot.subslots_[3].source_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  lVar7 = 0x2aaa0;
  do {
    plVar3 = *(long **)((long)this + lVar7 + -0x10);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
    lVar6 = lVar7 + -0x2a0;
    *(undefined8 *)((long)this + lVar7 + -0x10) = 0;
    lVar7 = 0;
    do {
      pvVar4 = *(void **)((long)ppuVar8 + lVar7 + -0x10);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,*(long *)((long)ppuVar8 + lVar7) - (long)pvVar4);
      }
      lVar7 = lVar7 + -0xa0;
    } while (lVar7 != -0x280);
    ppuVar8 = ppuVar8 + -0x54;
    lVar7 = lVar6;
  } while (lVar6 != 0x2a020);
  (this->ay_port_handler_).super_PortHandler._vptr_PortHandler =
       (_func_int **)&PTR_get_port_input_005a1e60;
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::~vector(&(this->ay_port_handler_).joysticks_);
  Speaker<true>::~Speaker(&this->speaker_);
  (this->tape_player_).super_TapePlayer.super_TimedEventLoop._vptr_TimedEventLoop =
       (_func_int **)&PTR_process_next_event_005aba68;
  (this->tape_player_).super_TapePlayer.super_Source._vptr_Source = (_func_int **)&DAT_005abaa8;
  this_00 = (this->tape_player_).super_TapePlayer.tape_.
            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->vdp_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059e920;
  pFVar5 = (this->vdp_).object_.super_Base<(TI::TMS::Personality)0>.crt_.vertical_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar5 != (Flywheel *)0x0) {
    operator_delete(pFVar5,0x24);
  }
  (this->vdp_).object_.super_Base<(TI::TMS::Personality)0>.crt_.vertical_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  pFVar5 = (this->vdp_).object_.super_Base<(TI::TMS::Personality)0>.crt_.horizontal_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar5 != (Flywheel *)0x0) {
    operator_delete(pFVar5,0x24);
  }
  (this->vdp_).object_.super_Base<(TI::TMS::Personality)0>.crt_.horizontal_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  CPU::Z80::ProcessorStorage::~ProcessorStorage((ProcessorStorage *)&this->z80_);
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a16c0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a16f0;
  Inputs::Keyboard::~Keyboard(&(this->super_MappedKeyboardMachine).keyboard_);
  return;
}

Assistant:

~ConcreteMachine() {
			speaker_.audio_queue.flush();
		}